

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O1

void __thiscall TEST_SimpleString_Copy_Test::testBody(TEST_SimpleString_Copy_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  char *pcVar3;
  char *pcVar4;
  TestTerminator *pTVar5;
  SimpleString s2;
  SimpleString s1;
  SimpleString local_38;
  SimpleString local_28;
  
  SimpleString::SimpleString(&s1,"hello");
  SimpleString::SimpleString(&s2,&s1);
  bVar1 = operator!=(&s1,&s2);
  if (bVar1) {
    bVar1 = operator!=(&s2,&s2);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                 ,0xdd);
    }
    bVar1 = operator!=(&s1,&s1);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Expected Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                 ,0xdd);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(&local_28);
    pcVar3 = SimpleString::asCharString(&local_28);
    StringFrom(&local_38);
    pcVar4 = SimpleString::asCharString(&local_38);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
               ,0xdd,pTVar5);
    SimpleString::~SimpleString(&local_38);
    SimpleString::~SimpleString(&local_28);
  }
  else {
    pUVar2 = UtestShell::getCurrent();
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
               ,0xdd,pTVar5);
  }
  SimpleString::~SimpleString(&s2);
  SimpleString::~SimpleString(&s1);
  return;
}

Assistant:

TEST(SimpleString, Copy)
{
    SimpleString s1("hello");
    SimpleString s2(s1);

    CHECK_EQUAL(s1, s2);
}